

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.hpp
# Opt level: O0

void __thiscall
tcu::Sampler::Sampler
          (Sampler *this,WrapMode wrapS_,WrapMode wrapT_,WrapMode wrapR_,FilterMode minFilter_,
          FilterMode magFilter_,float lodThreshold_,bool normalizedCoords_,CompareMode compare_,
          int compareChannel_,Vec4 *borderColor_,bool seamlessCubeMap_,
          DepthStencilMode depthStencilMode_)

{
  bool seamlessCubeMap__local;
  bool normalizedCoords__local;
  float lodThreshold__local;
  FilterMode magFilter__local;
  FilterMode minFilter__local;
  WrapMode wrapR__local;
  WrapMode wrapT__local;
  WrapMode wrapS__local;
  Sampler *this_local;
  
  this->wrapS = wrapS_;
  this->wrapT = wrapT_;
  this->wrapR = wrapR_;
  this->minFilter = minFilter_;
  this->magFilter = magFilter_;
  this->lodThreshold = lodThreshold_;
  this->normalizedCoords = normalizedCoords_;
  this->compare = compare_;
  this->compareChannel = compareChannel_;
  rr::GenericVec4::GenericVec4<float>(&this->borderColor,borderColor_);
  this->seamlessCubeMap = seamlessCubeMap_;
  this->depthStencilMode = depthStencilMode_;
  return;
}

Assistant:

Sampler (WrapMode			wrapS_,
			 WrapMode			wrapT_,
			 WrapMode			wrapR_,
			 FilterMode			minFilter_,
			 FilterMode			magFilter_,
			 float				lodThreshold_		= 0.0f,
			 bool				normalizedCoords_	= true,
			 CompareMode		compare_			= COMPAREMODE_NONE,
			 int				compareChannel_		= 0,
			 const Vec4&		borderColor_		= Vec4(0.0f, 0.0f, 0.0f, 0.0f),
			 bool				seamlessCubeMap_	= false,
			 DepthStencilMode	depthStencilMode_	= MODE_DEPTH)
		: wrapS				(wrapS_)
		, wrapT				(wrapT_)
		, wrapR				(wrapR_)
		, minFilter			(minFilter_)
		, magFilter			(magFilter_)
		, lodThreshold		(lodThreshold_)
		, normalizedCoords	(normalizedCoords_)
		, compare			(compare_)
		, compareChannel	(compareChannel_)
		, borderColor		(borderColor_)
		, seamlessCubeMap	(seamlessCubeMap_)
		, depthStencilMode	(depthStencilMode_)
	{
	}